

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O2

void __thiscall
CTestResource_TestUnifiedAuxSurface_Test::~CTestResource_TestUnifiedAuxSurface_Test
          (CTestResource_TestUnifiedAuxSurface_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(CTestResource, TestUnifiedAuxSurface)
{
    uint32_t TileSize[] = {128, 32};

    GMM_RESCREATE_PARAMS gmmParams        = {};
    gmmParams.Type                        = RESOURCE_2D;
    gmmParams.NoGfxMemory                 = 1;
    gmmParams.Flags.Gpu.Texture           = 1;
    gmmParams.Flags.Gpu.CCS               = 1;
    gmmParams.Flags.Gpu.UnifiedAuxSurface = 1;
    gmmParams.BaseWidth64                 = 0x100;
    gmmParams.BaseHeight                  = 0x100;
    gmmParams.Depth                       = 0x1;
    SetTileFlag(gmmParams, TEST_TILEY);

    for(uint32_t bpp = TEST_BPP_32; bpp <= TEST_BPP_128; bpp++) // 32/64/128 only
    {
        gmmParams.Format = SetResourceFormat(static_cast<TEST_BPP>(bpp));

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint64_t Pitch = GMM_ULT_ALIGN(gmmParams.BaseWidth64 * GetBppValue(static_cast<TEST_BPP>(bpp)), TileSize[0]);
        uint64_t Size  = Pitch * GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]);

        Size = GMM_ULT_ALIGN(Size, PAGE_SIZE);

        VerifyResourcePitch<true>(ResourceInfo, Pitch);
        VerifyResourcePitchInTiles<false>(ResourceInfo, Pitch / TileSize[0]);
        VerifyResourceSize<true>(ResourceInfo, Size);
        VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-arrayed

        uint32_t AuxPitch = Pitch;
        switch(bpp)
        {
            case TEST_BPP_32:
                AuxPitch /= 8;
                break;
            case TEST_BPP_64:
                AuxPitch /= 4;
                break;
            case TEST_BPP_128:
                AuxPitch /= 2;
                break;
        }
        uint64_t AuxSize = AuxPitch * GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]);
        AuxSize          = GMM_ULT_ALIGN(AuxSize, PAGE_SIZE);

        // Verify unified aux info
        EXPECT_EQ(AuxSize, ResourceInfo->GetSizeAuxSurface(GMM_AUX_CCS));

        if(ResourceInfo->Is64KBPageSuitable())
        {
            EXPECT_EQ(GMM_ULT_ALIGN(Size, 64 * PAGE_SIZE) + AuxSize, ResourceInfo->GetSizeSurface());
        }
        else
        {
            EXPECT_EQ(Size + AuxSize, ResourceInfo->GetSizeSurface());
        }

        EXPECT_EQ(256, ResourceInfo->GetAuxHAlign());
        EXPECT_EQ(128, ResourceInfo->GetAuxVAlign());
        EXPECT_EQ(0, ResourceInfo->GetAuxQPitch());
        EXPECT_EQ(AuxPitch, ResourceInfo->GetUnifiedAuxPitch());
        EXPECT_EQ(AuxPitch / TileSize[0], ResourceInfo->GetRenderAuxPitchTiles());
        EXPECT_EQ(Size, ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_CCS));

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}